

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O2

cbtScalar FindMaxSeparation(int *edgeIndex,cbtBox2dShape *poly1,cbtTransform *xf1,
                           cbtBox2dShape *poly2,cbtTransform *xf2)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int edge1;
  int edge1_00;
  int edge1_01;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  cbtVector3 cVar19;
  cbtVector3 dLocal1;
  cbtVector3 d;
  cbtScalar maxDot;
  undefined1 auVar5 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  auVar18 = in_ZMM1._8_56_;
  auVar13 = in_ZMM0._8_56_;
  cVar19 = cbtTransform::operator()(xf2,&poly2->m_centroid);
  auVar15._0_8_ = cVar19.m_floats._8_8_;
  auVar15._8_56_ = auVar18;
  auVar6._0_8_ = cVar19.m_floats._0_8_;
  auVar6._8_56_ = auVar13;
  cVar19 = cbtTransform::operator()(xf1,&poly1->m_centroid);
  auVar16._0_8_ = cVar19.m_floats._8_8_;
  auVar16._8_56_ = auVar18;
  auVar7._0_8_ = cVar19.m_floats._0_8_;
  auVar7._8_56_ = auVar13;
  auVar14 = vsubps_avx(auVar6._0_16_,auVar7._0_16_);
  auVar4 = vsubps_avx(auVar15._0_16_,auVar16._0_16_);
  auVar18 = ZEXT856(auVar4._8_8_);
  d.m_floats = (cbtScalar  [4])vinsertps_avx(auVar14,auVar4,0x28);
  auVar13 = ZEXT856(d.m_floats._8_8_);
  cbtMatrix3x3::transpose((cbtMatrix3x3 *)&maxDot,&xf1->m_basis);
  cVar19 = operator*((cbtMatrix3x3 *)&maxDot,&d);
  auVar17._0_8_ = cVar19.m_floats._8_8_;
  auVar17._8_56_ = auVar18;
  auVar8._0_8_ = cVar19.m_floats._0_8_;
  auVar8._8_56_ = auVar13;
  dLocal1.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar17._0_16_);
  lVar3 = cbtVector3::maxDot(&dLocal1,poly1->m_normals,4,&maxDot);
  edge1_00 = (int)lVar3;
  auVar9._0_4_ = EdgeSeparation(poly1,xf1,edge1_00,poly2,xf2);
  auVar9._4_60_ = extraout_var;
  auVar4 = auVar9._0_16_;
  auVar14 = auVar4;
  if (auVar9._0_4_ <= 0.0) {
    edge1_01 = edge1_00 + -1;
    if (edge1_00 < 1) {
      edge1_01 = 3;
    }
    auVar10._0_4_ = EdgeSeparation(poly1,xf1,edge1_01,poly2,xf2);
    auVar10._4_60_ = extraout_var_00;
    auVar5 = auVar10._0_16_;
    auVar14 = auVar5;
    if (auVar10._0_4_ <= 0.0) {
      edge1 = 0;
      if (edge1_00 < 3) {
        edge1 = edge1_00 + 1;
      }
      auVar11._0_4_ = EdgeSeparation(poly1,xf1,edge1,poly2,xf2);
      auVar11._4_60_ = extraout_var_01;
      auVar14 = auVar11._0_16_;
      if (auVar11._0_4_ <= 0.0) {
        uVar1 = vcmpps_avx512vl(auVar4,auVar5,1);
        uVar2 = vcmpps_avx512vl(auVar14,auVar5,1);
        if (((uVar1 & uVar2 & 1) != 0) ||
           (auVar5 = auVar14, edge1_01 = edge1, auVar9._0_4_ < auVar11._0_4_)) {
          do {
            edge1_00 = edge1_01;
            auVar4 = auVar5;
            if ((uVar1 & uVar2 & 1) == 0) {
              edge1_01 = edge1_00 + 1;
              if (2 < edge1_00) {
                edge1_01 = 0;
              }
            }
            else {
              edge1_01 = edge1_00 + -1;
              if (edge1_00 < 1) {
                edge1_01 = 3;
              }
            }
            auVar12._0_4_ = EdgeSeparation(poly1,xf1,edge1_01,poly2,xf2);
            auVar12._4_60_ = extraout_var_02;
            auVar14 = auVar12._0_16_;
            if (0.0 < auVar12._0_4_) goto LAB_00df1fea;
            auVar5 = auVar12._0_16_;
          } while (auVar4._0_4_ < auVar12._0_4_);
        }
        *edgeIndex = edge1_00;
        auVar14 = auVar4;
      }
    }
  }
LAB_00df1fea:
  return auVar14._0_4_;
}

Assistant:

static cbtScalar FindMaxSeparation(int* edgeIndex,
								  const cbtBox2dShape* poly1, const cbtTransform& xf1,
								  const cbtBox2dShape* poly2, const cbtTransform& xf2)
{
	int count1 = poly1->getVertexCount();
	const cbtVector3* normals1 = poly1->getNormals();

	// Vector pointing from the centroid of poly1 to the centroid of poly2.
	cbtVector3 d = b2Mul(xf2, poly2->getCentroid()) - b2Mul(xf1, poly1->getCentroid());
	cbtVector3 dLocal1 = b2MulT(xf1.getBasis(), d);

	// Find edge normal on poly1 that has the largest projection onto d.
	int edge = 0;
	cbtScalar maxDot;
	if (count1 > 0)
		edge = (int)dLocal1.maxDot(normals1, count1, maxDot);

	// Get the separation for the edge normal.
	cbtScalar s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
	if (s > 0.0f)
	{
		return s;
	}

	// Check the separation for the previous edge normal.
	int prevEdge = edge - 1 >= 0 ? edge - 1 : count1 - 1;
	cbtScalar sPrev = EdgeSeparation(poly1, xf1, prevEdge, poly2, xf2);
	if (sPrev > 0.0f)
	{
		return sPrev;
	}

	// Check the separation for the next edge normal.
	int nextEdge = edge + 1 < count1 ? edge + 1 : 0;
	cbtScalar sNext = EdgeSeparation(poly1, xf1, nextEdge, poly2, xf2);
	if (sNext > 0.0f)
	{
		return sNext;
	}

	// Find the best edge and the search direction.
	int bestEdge;
	cbtScalar bestSeparation;
	int increment;
	if (sPrev > s && sPrev > sNext)
	{
		increment = -1;
		bestEdge = prevEdge;
		bestSeparation = sPrev;
	}
	else if (sNext > s)
	{
		increment = 1;
		bestEdge = nextEdge;
		bestSeparation = sNext;
	}
	else
	{
		*edgeIndex = edge;
		return s;
	}

	// Perform a local search for the best edge normal.
	for (;;)
	{
		if (increment == -1)
			edge = bestEdge - 1 >= 0 ? bestEdge - 1 : count1 - 1;
		else
			edge = bestEdge + 1 < count1 ? bestEdge + 1 : 0;

		s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
		if (s > 0.0f)
		{
			return s;
		}

		if (s > bestSeparation)
		{
			bestEdge = edge;
			bestSeparation = s;
		}
		else
		{
			break;
		}
	}

	*edgeIndex = bestEdge;
	return bestSeparation;
}